

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_ego_flags(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  errr eVar3;
  parser_error pVar4;
  void *pvVar5;
  char *pcVar6;
  char *flag_name;
  
  pvVar5 = parser_priv(p);
  if (pvVar5 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar4 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar6 = parser_getstr(p,"flags");
      pcVar6 = string_make(pcVar6);
      flag_name = strtok(pcVar6," |");
      while (flag_name != (char *)0x0) {
        eVar2 = grab_flag((bitflag *)((long)pvVar5 + 0x20),5,obj_flags,flag_name);
        eVar3 = grab_flag((bitflag *)((long)pvVar5 + 0x2a),2,kind_flags,flag_name);
        _Var1 = grab_element_flag((element_info *)((long)pvVar5 + 0x16c),flag_name);
        if ((!_Var1 && eVar3 != 0) && eVar2 != 0) goto LAB_00184f26;
        flag_name = strtok((char *)0x0," |");
      }
      flag_name = (char *)0x0;
LAB_00184f26:
      string_free(pcVar6);
      pVar4 = PARSE_ERROR_INVALID_FLAG;
      if (flag_name == (char *)0x0) {
        pVar4 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_ego_flags(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	char *flags;
	char *t;

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "flags")) {
		return PARSE_ERROR_NONE;
	}
	flags = string_make(parser_getstr(p, "flags"));
	t = strtok(flags, " |");
	while (t) {
		bool found = false;
		if (!grab_flag(e->flags, OF_SIZE, obj_flags, t)) {
			found = true;
		}
		if (!grab_flag(e->kind_flags, KF_SIZE, kind_flags, t)) {
			found = true;
		}
		if (grab_element_flag(e->el_info, t)) {
			found = true;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}
	string_free(flags);
	return t ? PARSE_ERROR_INVALID_FLAG : PARSE_ERROR_NONE;
}